

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_5UL> kj::hex(unsigned_short i)

{
  size_t sVar1;
  byte *pbVar2;
  undefined6 in_register_0000003a;
  ulong uVar3;
  CappedArray<char,_5UL> CVar4;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  uVar3 = CONCAT62(in_register_0000003a,i);
  result.currentSize = 5;
  if ((int)uVar3 == 0) {
    pbVar2 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    pbVar2 = reverse;
    for (; (short)uVar3 != 0; uVar3 = (uVar3 & 0xffff) >> 4) {
      *pbVar2 = (byte)uVar3 & 0xf;
      pbVar2 = pbVar2 + 1;
    }
  }
  sVar1 = 0;
  for (; reverse < pbVar2; pbVar2 = pbVar2 + -1) {
    result.content[sVar1] = "0123456789abcdef"[pbVar2[-1]];
    sVar1 = sVar1 + 1;
  }
  CVar4._8_8_ = result._8_8_ & 0xffffffffff;
  CVar4.currentSize = sVar1;
  return CVar4;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}